

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O1

void __thiscall
Potassco::AspifTextOutput::rule
          (AspifTextOutput *this,Head_t ht,AtomSpan *head,Weight_t bound,WeightLitSpan *lits)

{
  int iVar1;
  pointer puVar2;
  pointer puVar3;
  size_t sVar4;
  WeightLit_t *pWVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  WeightLit_t *pWVar9;
  LitSpan local_48;
  
  if (lits->size == 0) {
    local_48.first = (int *)0x0;
    local_48.size = 0;
    rule(this,ht,head,&local_48);
  }
  push(this,1);
  push(this,ht.val_);
  push(this,head);
  puVar2 = (this->data_->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (this->data_->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar7 = lits->first->weight;
  push(this,1);
  push(this,bound);
  push(this,(uint32_t)lits->size);
  iVar6 = iVar7;
  if (lits->size != 0) {
    pWVar9 = lits->first;
    pWVar5 = pWVar9 + lits->size;
    do {
      push(this,pWVar9->lit);
      push(this,pWVar9->weight);
      iVar1 = pWVar9->weight;
      if (iVar1 < iVar7) {
        iVar7 = iVar1;
      }
      if (iVar6 < iVar1) {
        iVar6 = iVar1;
      }
      pWVar9 = pWVar9 + 1;
    } while (pWVar9 != pWVar5);
  }
  if (iVar7 == iVar6) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->data_->directives,(ulong)((long)puVar2 - (long)puVar3) >> 2 & 0xffffffff);
    push(this,2);
    push(this,(bound + iVar7 + -1) / iVar7);
    push(this,(uint32_t)lits->size);
    sVar4 = lits->size;
    if (sVar4 != 0) {
      pWVar5 = lits->first;
      lVar8 = 0;
      do {
        push(this,*(uint32_t *)((long)&pWVar5->lit + lVar8));
        lVar8 = lVar8 + 8;
      } while (sVar4 << 3 != lVar8);
    }
  }
  return;
}

Assistant:

void AspifTextOutput::rule(Head_t ht, const AtomSpan& head, Weight_t bound, const WeightLitSpan& lits) {
	if (size(lits) == 0) {
		AspifTextOutput::rule(ht, head, toSpan<Lit_t>());
	}
	push(Directive_t::Rule).push(static_cast<uint32_t>(ht)).push(head);
	uint32_t top = static_cast<uint32_t>(data_->directives.size());
	Weight_t min = weight(*begin(lits)), max = min;
	push(Body_t::Sum).push(bound).push(static_cast<uint32_t>(size(lits)));
	for (const WeightLit_t* it = begin(lits), *end = Potassco::end(lits); it != end; ++it) {
		push(Potassco::lit(*it)).push(Potassco::weight(*it));
		if (Potassco::weight(*it) < min) { min = Potassco::weight(*it); }
		if (Potassco::weight(*it) > max) { max = Potassco::weight(*it); }
	}
	if (min == max) {
		data_->directives.resize(top);
		bound = (bound + min-1)/min;
		push(Body_t::Count).push(bound).push(static_cast<uint32_t>(size(lits)));
		for (const WeightLit_t* it = begin(lits), *end = Potassco::end(lits); it != end; ++it) {
			push(Potassco::lit(*it));
		}
	}
}